

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

bool __thiscall VcprojGenerator::writeMakefile(VcprojGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  XmlOutput xmlOut;
  undefined1 local_128 [64];
  undefined1 *local_e8;
  Data *pDStack_e0;
  QString *local_d8;
  undefined1 *puStack_d0;
  ProKey local_c8;
  ProString local_98;
  ProKey local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
    _vptr_QMakeSourceFileInfo[0x2a])();
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_68,"TEMPLATE");
  QMakeEvaluator::first((ProString *)local_128,&pQVar1->super_QMakeEvaluator,&local_68);
  bVar3 = ProString::operator==((ProString *)local_128,"vcsubdirs");
  if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
    }
  }
  if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar3) {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QVar5.m_data = (storage_type *)0xa;
    QVar5.m_size = (qsizetype)local_128;
    QString::fromUtf8(QVar5);
    uVar2 = local_128._0_8_;
    config.m_data = (storage_type_conflict *)local_128._8_8_;
    config.m_size = local_128._16_8_;
    bVar3 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
    if ((QArrayData *)uVar2 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar2,2,0x10);
      }
    }
    if (bVar3) {
      bVar3 = true;
      if (Option::debug_level != 0) {
        debug_msg_internal(1,"Generator: MSVC.NET: Not writing solution file for build_pass configs"
                          );
      }
    }
    else {
      if (Option::debug_level != 0) {
        debug_msg_internal(1,"Generator: MSVC.NET: Writing solution file");
      }
      writeSubDirs(this,t);
      bVar3 = true;
    }
  }
  else {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_68,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_128,&pQVar1->super_QMakeEvaluator,&local_68);
    bVar4 = ProString::operator==((ProString *)local_128,"vcapp");
    bVar3 = true;
    if (!bVar4) {
      pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey(&local_c8,"TEMPLATE");
      QMakeEvaluator::first(&local_98,&pQVar1->super_QMakeEvaluator,&local_c8);
      bVar3 = ProString::operator==(&local_98,"vclib");
      if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
      }
    }
    if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    if (bVar3 == false) {
      QVar7.m_data = (storage_type *)0xa;
      QVar7.m_size = (qsizetype)local_128;
      QString::fromUtf8(QVar7);
      uVar2 = local_128._0_8_;
      config_01.m_data = (storage_type_conflict *)local_128._8_8_;
      config_01.m_size = local_128._16_8_;
      bVar3 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_01,false);
      if ((QArrayData *)uVar2 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar2,2,0x10);
        }
      }
    }
    else {
      QVar6.m_data = (storage_type *)0xa;
      QVar6.m_size = (qsizetype)local_128;
      QString::fromUtf8(QVar6);
      uVar2 = local_128._0_8_;
      config_00.m_data = (storage_type_conflict *)local_128._8_8_;
      config_00.m_size = local_128._16_8_;
      bVar4 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_00,false);
      if ((QArrayData *)uVar2 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar2,2,0x10);
        }
      }
      bVar3 = true;
      if (!bVar4) {
        if (Option::debug_level != 0) {
          debug_msg_internal(1,"Generator: MSVC.NET: Writing single configuration project file");
        }
        local_d8 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
        local_e8 = &DAT_aaaaaaaaaaaaaaaa;
        pDStack_e0 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_128._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_128._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_128._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_128._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_128._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_128._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_128._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        XmlOutput::XmlOutput((XmlOutput *)local_128,t,XMLConversion);
        (*this->projectWriter->_vptr_VCProjectWriter[2])
                  (this->projectWriter,local_128,&this->vcProject);
        XmlOutput::~XmlOutput((XmlOutput *)local_128);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool VcprojGenerator::writeMakefile(QTextStream &t)
{
    initProject(); // Fills the whole project with proper data

    // Generate solution file
    if(project->first("TEMPLATE") == "vcsubdirs") {
        if (!project->isActiveConfig("build_pass")) {
            debug_msg(1, "Generator: MSVC.NET: Writing solution file");
            writeSubDirs(t);
        } else {
            debug_msg(1, "Generator: MSVC.NET: Not writing solution file for build_pass configs");
        }
        return true;
    } else
    // Generate single configuration project file
    if (project->first("TEMPLATE") == "vcapp" ||
        project->first("TEMPLATE") == "vclib") {
        if(!project->isActiveConfig("build_pass")) {
            debug_msg(1, "Generator: MSVC.NET: Writing single configuration project file");
            XmlOutput xmlOut(t);
            projectWriter->write(xmlOut, vcProject);
        }
        return true;
    }
    return project->isActiveConfig("build_pass");
}